

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParsePageSize(WastParser *this,uint32_t *out_page_size)

{
  uint uVar1;
  char *s;
  bool bVar2;
  Result RVar3;
  Result RVar4;
  Literal *pLVar5;
  Enum EVar6;
  Location *__return_storage_ptr__;
  Location local_108;
  Location local_e8;
  Token token;
  Location local_88;
  Token local_68;
  
  bVar2 = PeekMatchLpar(this,PageSize);
  EVar6 = Ok;
  if (bVar2) {
    if (this->options_[0x12] == (WastParseOptions)0x0) {
      GetLocation(&local_88,this);
      Error(this,0x1e1b30);
      EVar6 = Error;
    }
    else {
      RVar3 = Expect(this,Lpar);
      EVar6 = Error;
      if ((RVar3.enum_ != Error) && (RVar3 = Expect(this,PageSize), RVar3.enum_ != Error)) {
        GetToken(&token,this);
        if (token.token_type_ - First_Literal < 3) {
          pLVar5 = Token::literal(&token);
          s = (pLVar5->text)._M_str;
          RVar3 = ParseInt32(s,s + (pLVar5->text)._M_len,out_page_size,UnsignedOnly);
          uVar1 = *out_page_size - 1;
          if (uVar1 < (*out_page_size ^ uVar1)) {
            Consume(&local_68,this);
            RVar4 = Expect(this,Rpar);
            if (RVar4.enum_ == Error) {
              return (Result)Error;
            }
            return (Result)(uint)(RVar3.enum_ == Error);
          }
          __return_storage_ptr__ = &local_108;
        }
        else {
          __return_storage_ptr__ = &local_e8;
        }
        GetLocation(__return_storage_ptr__,this);
        Error(this,0x1e1b5b);
      }
    }
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParsePageSize(uint32_t* out_page_size) {
  WABT_TRACE(ParsePageSize);

  Result result = Result::Ok;

  if (PeekMatchLpar(TokenType::PageSize)) {
    if (!options_->features.custom_page_sizes_enabled()) {
      Error(GetLocation(), "Specifying memory page size is not allowed");
      return Result::Error;
    }
    EXPECT(Lpar);
    EXPECT(PageSize);
    auto token = GetToken();
    if (!token.HasLiteral()) {
      Error(GetLocation(), "malformed custom page size");
      return Result::Error;
    }
    auto sv = token.literal().text;
    result |= ParseInt32(sv, out_page_size, ParseIntType::UnsignedOnly);
    if (*out_page_size > UINT32_MAX || *out_page_size <= 0 ||
        (*out_page_size & (*out_page_size - 1))) {
      Error(GetLocation(), "malformed custom page size");
      return Result::Error;
    }
    Consume();
    EXPECT(Rpar);
  }

  return result;
}